

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void comparison(Vm *vm)

{
  OP_CODE op_code;
  _Bool _Var1;
  uint uVar2;
  
  arith_expr(vm);
  do {
    _Var1 = match(vm,TOKEN_SMALLER);
    if (!_Var1) {
      _Var1 = match(vm,TOKEN_SMALLER_EQUALS);
      if (!_Var1) {
        _Var1 = match(vm,TOKEN_GREATER);
        if (!_Var1) {
          _Var1 = match(vm,TOKEN_GREATER_EQUALS);
          if (!_Var1) {
            return;
          }
        }
      }
    }
    uVar2 = (vm->compiler).previous.type - TOKEN_SMALLER;
    if (uVar2 < 4) {
      op_code = *(OP_CODE *)(&DAT_00107950 + (ulong)uVar2 * 4);
      arith_expr(vm);
      emit_no_arg(vm,op_code);
    }
  } while( true );
}

Assistant:

static void comparison(Vm *vm) {
    arith_expr(vm);

    while (match(vm, TOKEN_SMALLER) || match(vm, TOKEN_SMALLER_EQUALS)
           || match(vm, TOKEN_GREATER) || match(vm, TOKEN_GREATER_EQUALS)) {
        switch (vm->compiler.previous.type) {
            case TOKEN_SMALLER:
                arith_expr(vm);
                emit_no_arg(vm, OP_LT);
                break;
            case TOKEN_SMALLER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_LE);
                break;
            case TOKEN_GREATER:
                arith_expr(vm);
                emit_no_arg(vm, OP_GT);
                break;
            case TOKEN_GREATER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_GE);
                break;
            default:
                break;
        }
    }
}